

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Ineighbor_alltoall
              (void *sendbuf,int sendcount,MPIABI_Datatype senddtype,void *recvbuf,int recvcount,
              MPIABI_Datatype recvtype,MPIABI_Comm comm,MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Ineighbor_alltoall();
  return iVar1;
}

Assistant:

int MPIABI_Ineighbor_alltoall(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype senddtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ineighbor_alltoall(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)senddtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}